

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageOperands
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info,uint32_t word_index)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Op OVar11;
  int32_t iVar12;
  spv_result_t sVar13;
  int iVar14;
  size_t sVar15;
  Instruction *pIVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  Op opcode;
  uint uVar20;
  uint64_t array_size;
  DiagnosticStream local_208;
  
  if (((anonymous_namespace)::
       ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
       ::kAllImageOperandsHandled == '\0') &&
     (iVar14 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
                                    ::kAllImageOperandsHandled), iVar14 != 0)) {
    ValidateImageOperands::kAllImageOperandsHandled = true;
    __cxa_guard_release(&(anonymous_namespace)::
                         ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
                         ::kAllImageOperandsHandled);
  }
  uVar1 = (inst->inst_).opcode;
  puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar18 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  uVar17 = (ulong)(word_index - 1);
  if (uVar17 < uVar18) {
    uVar20 = puVar2[uVar17];
    sVar15 = utils::CountSetBits<unsigned_int>(uVar20 & 0xffff83ff);
    if (sVar15 + ((uVar20 >> 2 & 1) != 0) == uVar18 - word_index) goto LAB_001c93e7;
LAB_001c93c3:
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar19 = "Number of image operand ids doesn\'t correspond to the bit mask";
  }
  else {
    uVar20 = 0;
    if (uVar18 != uVar17) goto LAB_001c93c3;
LAB_001c93e7:
    if ((info->multisampled & ((uVar20 & 0x40) >> 6 ^ 1)) == 0) {
      if (uVar20 == 0) {
        return SPV_SUCCESS;
      }
      sVar15 = utils::CountSetBits<unsigned_int>(uVar20 & 0x10038);
      if (sVar15 < 2) {
        bVar3 = IsImplicitLod((uint)uVar1);
        bVar4 = IsExplicitLod((uint)uVar1);
        if ((uVar1 - 0x62 < 2) || (bVar5 = bVar4, uVar1 == 0x140)) {
          bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityImageReadWriteLodAMD);
        }
        if ((uVar1 == 0x13a) || (uVar1 == 0x60)) {
          bVar6 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityImageGatherBiasLodAMD);
        }
        else {
          bVar6 = false;
        }
        if ((uVar20 & 1) == 0) {
LAB_001c9507:
          if ((uVar20 & 2) == 0) {
            if ((uVar20 & 4) == 0) {
              bVar4 = false;
LAB_001c97a4:
              opcode = (Op)uVar1;
              if ((uVar20 & 8) == 0) {
LAB_001c97ae:
                if ((uVar20 & 0x10) != 0) {
                  if (info->dim == Cube) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar19 = "Image Operand Offset cannot be used with Cube Image \'Dim\'";
                    goto LAB_001c9417;
                  }
                  uVar9 = ValidationState_t::GetTypeId
                                    (_,(inst->words_).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[word_index]);
                  bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
                  if (!bVar5) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar19 = "Expected Image Operand Offset to be int scalar or ";
                    goto LAB_001c9baf;
                  }
                  uVar10 = GetPlaneCoordSize(info);
                  uVar9 = ValidationState_t::GetDimension(_,uVar9);
                  if (uVar10 != uVar9) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    std::operator<<((ostream *)&local_208,"Expected Image Operand Offset to have ");
                    goto LAB_001c9e8c;
                  }
                  word_index = word_index + 1;
                  if (((_->options_->before_hlsl_legalization == false) &&
                      (bVar5 = spvIsVulkanEnv(_->context_->target_env), bVar5)) &&
                     ((1 < opcode - OpImageGather && (1 < opcode - OpImageSparseGather)))) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_
                              ((string *)&array_size,_,0x1237,(char *)0x0);
                    std::operator<<((ostream *)&local_208,(string *)&array_size);
                    std::operator<<((ostream *)&local_208,
                                    "Image Operand Offset can only be used with OpImage*Gather operations"
                                   );
                    std::__cxx11::string::_M_dispose();
                    goto LAB_001c9426;
                  }
                }
                if ((uVar20 & 0x20) == 0) {
LAB_001c97c2:
                  if ((uVar20 & 0x40) == 0) {
LAB_001c9836:
                    if (-1 < (char)uVar20) {
LAB_001c983f:
                      if ((uVar20 >> 8 & 1) == 0) {
LAB_001c984a:
                        if ((uVar20 >> 9 & 1) == 0) {
                          return SPV_SUCCESS;
                        }
                        if ((opcode != OpImageRead) && (opcode != OpImageSparseRead)) {
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          std::operator<<((ostream *)&local_208,
                                          "Image Operand MakeTexelVisibleKHR can only be used with Op"
                                         );
                          pcVar19 = spvOpcodeString(OpImageRead);
                          std::operator<<((ostream *)&local_208,pcVar19);
                          std::operator<<((ostream *)&local_208," or Op");
                          OVar11 = OpImageSparseRead;
                          goto LAB_001ca0f9;
                        }
                        if ((uVar20 >> 10 & 1) != 0) {
                          sVar13 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [word_index]);
                          if (sVar13 == SPV_SUCCESS) {
                            return SPV_SUCCESS;
                          }
                          return sVar13;
                        }
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar19 = 
                        "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR is also specified: Op"
                        ;
                      }
                      else {
                        if (opcode == OpImageWrite) {
                          if ((uVar20 >> 10 & 1) == 0) {
                            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                            std::operator<<((ostream *)&local_208,
                                            "Image Operand MakeTexelAvailableKHR requires NonPrivateTexelKHR is also specified: Op"
                                           );
                            pcVar19 = spvOpcodeString(OpImageWrite);
                            goto LAB_001c9417;
                          }
                          sVar13 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [word_index]);
                          if (sVar13 != SPV_SUCCESS) {
                            return sVar13;
                          }
                          word_index = word_index + 1;
                          goto LAB_001c984a;
                        }
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        std::operator<<((ostream *)&local_208,
                                        "Image Operand MakeTexelAvailableKHR can only be used with Op"
                                       );
                        OVar11 = OpImageWrite;
LAB_001ca0f9:
                        pcVar19 = spvOpcodeString(OVar11);
                        std::operator<<((ostream *)&local_208,pcVar19);
                        pcVar19 = ": Op";
                      }
                      std::operator<<((ostream *)&local_208,pcVar19);
                      pcVar19 = spvOpcodeString(opcode);
                      std::operator<<((ostream *)&local_208,pcVar19);
                      goto LAB_001c9426;
                    }
                    if (bVar4 || bVar3) {
                      uVar9 = ValidationState_t::GetTypeId
                                        (_,(inst->words_).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[word_index]);
                      bVar3 = ValidationState_t::IsFloatScalarType(_,uVar9);
                      if (bVar3) {
                        if (info->dim < Rect) {
                          if (info->multisampled == 0) {
                            word_index = word_index + 1;
                            goto LAB_001c983f;
                          }
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar19 = "Image Operand MinLod requires \'MS\' parameter to be 0";
                        }
                        else {
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar19 = 
                          "Image Operand MinLod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube"
                          ;
                        }
                      }
                      else {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar19 = "Expected Image Operand MinLod to be float scalar";
                      }
                    }
                    else {
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      std::operator<<((ostream *)&local_208,
                                      "Image Operand MinLod can only be used with ImplicitLod ");
                      pcVar19 = "opcodes or together with Image Operand Grad";
                    }
                  }
                  else if ((((opcode - OpImageFetch < 5) &&
                            ((0x19U >> (opcode - OpImageFetch & 0x1f) & 1) != 0)) ||
                           (opcode == OpImageSparseFetch)) || (opcode == OpImageSparseRead)) {
                    if (info->multisampled == 0) {
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar19 = "Image Operand Sample requires non-zero \'MS\' parameter";
                    }
                    else {
                      uVar9 = ValidationState_t::GetTypeId
                                        (_,(inst->words_).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[word_index]);
                      bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
                      if (bVar5) {
                        word_index = word_index + 1;
                        goto LAB_001c9836;
                      }
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar19 = "Expected Image Operand Sample to be int scalar";
                    }
                  }
                  else {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    std::operator<<((ostream *)&local_208,
                                    "Image Operand Sample can only be used with OpImageFetch, ");
                    std::operator<<((ostream *)&local_208,
                                    "OpImageRead, OpImageWrite, OpImageSparseFetch and ");
                    pcVar19 = "OpImageSparseRead";
                  }
                }
                else if ((opcode - OpImageGather < 2) || (opcode - OpImageSparseGather < 2)) {
                  if (info->dim == Cube) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar19 = "Image Operand ConstOffsets cannot be used with Cube Image \'Dim\'";
                  }
                  else {
                    uVar9 = (inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[word_index];
                    uVar10 = ValidationState_t::GetTypeId(_,uVar9);
                    pIVar16 = ValidationState_t::FindDef(_,uVar10);
                    if (pIVar16 == (Instruction *)0x0) {
                      __assert_fail("type_inst",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                                    ,0x1ea,
                                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                                   );
                    }
                    if ((pIVar16->inst_).opcode == 0x1c) {
                      array_size = 0;
                      bVar5 = ValidationState_t::EvalConstantValUint64
                                        (_,(pIVar16->words_).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[3],&array_size)
                      ;
                      if (!bVar5) {
                        __assert_fail("0 && \"Array type definition is corrupt\"",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                                      ,499,
                                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                                     );
                      }
                      if (array_size == 4) {
                        uVar10 = (pIVar16->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[2];
                        bVar5 = ValidationState_t::IsIntVectorType(_,uVar10);
                        if ((bVar5) &&
                           (uVar10 = ValidationState_t::GetDimension(_,uVar10), uVar10 == 2)) {
                          OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
                          iVar12 = spvOpcodeIsConstant(OVar11);
                          if (iVar12 != 0) {
                            word_index = word_index + 1;
                            goto LAB_001c97c2;
                          }
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar19 = "Expected Image Operand ConstOffsets to be a const object";
                        }
                        else {
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          pcVar19 = 
                          "Expected Image Operand ConstOffsets array components to be int vectors of size 2"
                          ;
                        }
                        goto LAB_001c9417;
                      }
                    }
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar19 = "Expected Image Operand ConstOffsets to be an array of size 4";
                  }
                }
                else {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar19 = 
                  "Image Operand ConstOffsets can only be used with OpImageGather and OpImageDrefGather"
                  ;
                }
              }
              else if (info->dim == Cube) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar19 = "Image Operand ConstOffset cannot be used with Cube Image \'Dim\'";
              }
              else {
                uVar9 = (inst->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[word_index];
                uVar10 = ValidationState_t::GetTypeId(_,uVar9);
                bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar10);
                if (bVar5) {
                  OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
                  iVar12 = spvOpcodeIsConstant(OVar11);
                  if (iVar12 != 0) {
                    uVar9 = GetPlaneCoordSize(info);
                    uVar10 = ValidationState_t::GetDimension(_,uVar10);
                    if (uVar9 != uVar10) {
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      std::operator<<((ostream *)&local_208,
                                      "Expected Image Operand ConstOffset to have ");
                      goto LAB_001c9e8c;
                    }
                    word_index = word_index + 1;
                    goto LAB_001c97ae;
                  }
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar19 = "Expected Image Operand ConstOffset to be a const object";
                }
                else {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar19 = "Expected Image Operand ConstOffset to be int scalar or ";
LAB_001c9baf:
                  std::operator<<((ostream *)&local_208,pcVar19);
                  pcVar19 = "vector";
                }
              }
            }
            else if (bVar4) {
              uVar9 = ValidationState_t::GetTypeId
                                (_,(inst->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[word_index]);
              uVar10 = ValidationState_t::GetTypeId
                                 (_,(inst->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[word_index + 1]);
              bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
              if ((bVar4) && (bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar10), bVar4)
                 ) {
                uVar8 = GetPlaneCoordSize(info);
                uVar9 = ValidationState_t::GetDimension(_,uVar9);
                uVar10 = ValidationState_t::GetDimension(_,uVar10);
                if (uVar8 == uVar9) {
                  if (uVar8 == uVar10) {
                    word_index = word_index + 2;
                    bVar4 = true;
                    goto LAB_001c97a4;
                  }
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  std::operator<<((ostream *)&local_208,"Expected Image Operand Grad dy to have ");
LAB_001c9e8c:
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::operator<<((ostream *)&local_208," components, but given ");
                }
                else {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  std::operator<<((ostream *)&local_208,"Expected Image Operand Grad dx to have ");
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::operator<<((ostream *)&local_208," components, but given ");
                }
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                goto LAB_001c9426;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)&local_208,
                              "Expected both Image Operand Grad ids to be float scalars or ");
              pcVar19 = "vectors";
            }
            else {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar19 = "Image Operand Grad can only be used with ExplicitLod opcodes";
            }
          }
          else if ((((bVar5 == false) && (uVar1 != 0x5f)) && (uVar1 != 0x139)) && (bVar6 == false))
          {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::operator<<((ostream *)&local_208,
                            "Image Operand Lod can only be used with ExplicitLod opcodes ");
            pcVar19 = "and OpImageFetch";
          }
          else if ((uVar20 & 4) == 0) {
            uVar9 = ValidationState_t::GetTypeId
                              (_,(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[word_index]);
            if ((bVar4 | bVar6) == 1) {
              bVar4 = ValidationState_t::IsFloatScalarType(_,uVar9);
              if (bVar4) {
LAB_001c9786:
                if (info->dim < Rect) {
                  word_index = word_index + 1;
                  bVar4 = false;
                  goto LAB_001c97a4;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar19 = "Image Operand Lod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
              }
              else {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::operator<<((ostream *)&local_208,
                                "Expected Image Operand Lod to be float scalar when used ");
                pcVar19 = "with ExplicitLod";
              }
            }
            else {
              bVar4 = ValidationState_t::IsIntScalarType(_,uVar9);
              if (bVar4) goto LAB_001c9786;
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::operator<<((ostream *)&local_208,
                              "Expected Image Operand Lod to be int scalar when used with ");
              pcVar19 = "OpImageFetch";
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand bits Lod and Grad cannot be set at the same time";
          }
        }
        else if (bVar3 || bVar6 != false) {
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[word_index]);
          bVar7 = ValidationState_t::IsFloatScalarType(_,uVar9);
          if (bVar7) {
            if (info->dim < Rect) {
              word_index = word_index + 1;
              goto LAB_001c9507;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Image Operand Bias requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar19 = "Expected Image Operand Bias to be float scalar";
          }
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar19 = "Image Operand Bias can only be used with ImplicitLod opcodes";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar19 = 
        "Image Operands Offset, ConstOffset, ConstOffsets, Offsets cannot be used together";
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar19 = "Image Operand Sample is required for operation on multi-sampled image";
    }
  }
LAB_001c9417:
  std::operator<<((ostream *)&local_208,pcVar19);
LAB_001c9426:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateImageOperands(ValidationState_t& _,
                                   const Instruction* inst,
                                   const ImageTypeInfo& info,
                                   uint32_t word_index) {
  static const bool kAllImageOperandsHandled = CheckAllImageOperandsHandled();
  (void)kAllImageOperandsHandled;

  const spv::Op opcode = inst->opcode();
  const size_t num_words = inst->words().size();

  const bool have_explicit_mask = (word_index - 1 < num_words);
  const uint32_t mask = have_explicit_mask ? inst->word(word_index - 1) : 0u;

  if (have_explicit_mask) {
    // NonPrivate, Volatile, SignExtend, ZeroExtend take no operand words.
    const uint32_t mask_bits_having_operands =
        mask & ~uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR |
                         spv::ImageOperandsMask::VolatileTexelKHR |
                         spv::ImageOperandsMask::SignExtend |
                         spv::ImageOperandsMask::ZeroExtend |
                         spv::ImageOperandsMask::Nontemporal);
    size_t expected_num_image_operand_words =
        spvtools::utils::CountSetBits(mask_bits_having_operands);
    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      // Grad uses two words.
      ++expected_num_image_operand_words;
    }

    if (expected_num_image_operand_words != num_words - word_index) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Number of image operand ids doesn't correspond to the bit "
                "mask";
    }
  } else if (num_words != word_index - 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Number of image operand ids doesn't correspond to the bit mask";
  }

  if (info.multisampled &
      (0 == (mask & uint32_t(spv::ImageOperandsMask::Sample)))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operand Sample is required for operation on "
              "multi-sampled image";
  }

  // After this point, only set bits in the image operands mask can cause
  // the module to be invalid.
  if (mask == 0) return SPV_SUCCESS;

  if (spvtools::utils::CountSetBits(
          mask & uint32_t(spv::ImageOperandsMask::Offset |
                          spv::ImageOperandsMask::ConstOffset |
                          spv::ImageOperandsMask::ConstOffsets |
                          spv::ImageOperandsMask::Offsets)) > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operands Offset, ConstOffset, ConstOffsets, Offsets "
              "cannot be used together";
  }

  const bool is_implicit_lod = IsImplicitLod(opcode);
  const bool is_explicit_lod = IsExplicitLod(opcode);
  const bool is_valid_lod_operand = IsValidLodOperand(_, opcode);
  const bool is_valid_gather_lod_bias_amd = IsValidGatherLodBiasAMD(_, opcode);

  // The checks should be done in the order of definition of OperandImage.

  if (mask & uint32_t(spv::ImageOperandsMask::Bias)) {
    if (!is_implicit_lod && !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias can only be used with ImplicitLod opcodes";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Bias to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Lod)) {
    if (!is_valid_lod_operand && opcode != spv::Op::OpImageFetch &&
        opcode != spv::Op::OpImageSparseFetch &&
        !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod can only be used with ExplicitLod opcodes "
             << "and OpImageFetch";
    }

    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand bits Lod and Grad cannot be set at the same "
                "time";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (is_explicit_lod || is_valid_gather_lod_bias_amd) {
      if (!_.IsFloatScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be float scalar when used "
               << "with ExplicitLod";
      }
    } else {
      if (!_.IsIntScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be int scalar when used with "
               << "OpImageFetch";
      }
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
    if (!is_explicit_lod) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Grad can only be used with ExplicitLod opcodes";
    }

    const uint32_t dx_type_id = _.GetTypeId(inst->word(word_index++));
    const uint32_t dy_type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarOrVectorType(dx_type_id) ||
        !_.IsFloatScalarOrVectorType(dy_type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected both Image Operand Grad ids to be float scalars or "
             << "vectors";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t dx_size = _.GetDimension(dx_type_id);
    const uint32_t dy_size = _.GetDimension(dy_type_id);
    if (plane_size != dx_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dx to have " << plane_size
             << " components, but given " << dx_size;
    }

    if (plane_size != dy_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dy to have " << plane_size
             << " components, but given " << dy_size;
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffset cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be int scalar or "
             << "vector";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be a const object";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to have " << plane_size
             << " components, but given " << offset_size;
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Offset cannot be used with Cube Image 'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to be int scalar or "
             << "vector";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to have " << plane_size
             << " components, but given " << offset_size;
    }

    if (!_.options()->before_hlsl_legalization &&
        spvIsVulkanEnv(_.context()->target_env)) {
      if (opcode != spv::Op::OpImageGather &&
          opcode != spv::Op::OpImageDrefGather &&
          opcode != spv::Op::OpImageSparseGather &&
          opcode != spv::Op::OpImageSparseDrefGather) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4663)
               << "Image Operand Offset can only be used with "
                  "OpImage*Gather operations";
      }
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffsets)) {
    if (opcode != spv::Op::OpImageGather &&
        opcode != spv::Op::OpImageDrefGather &&
        opcode != spv::Op::OpImageSparseGather &&
        opcode != spv::Op::OpImageSparseDrefGather) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets can only be used with "
                "OpImageGather and OpImageDrefGather";
    }

    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    const Instruction* type_inst = _.FindDef(type_id);
    assert(type_inst);

    if (type_inst->opcode() != spv::Op::OpTypeArray) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    uint64_t array_size = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
      assert(0 && "Array type definition is corrupt");
    }

    if (array_size != 4) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    const uint32_t component_type = type_inst->word(2);
    if (!_.IsIntVectorType(component_type) ||
        _.GetDimension(component_type) != 2) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets array components to be "
                "int vectors of size 2";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be a const object";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Sample)) {
    if (opcode != spv::Op::OpImageFetch && opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageWrite &&
        opcode != spv::Op::OpImageSparseFetch &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample can only be used with OpImageFetch, "
             << "OpImageRead, OpImageWrite, OpImageSparseFetch and "
             << "OpImageSparseRead";
    }

    if (info.multisampled == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample requires non-zero 'MS' parameter";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsIntScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Sample to be int scalar";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MinLod)) {
    if (!is_implicit_lod && !(mask & uint32_t(spv::ImageOperandsMask::Grad))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod can only be used with ImplicitLod "
             << "opcodes or together with Image Operand Grad";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand MinLod to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'Dim' parameter to be 1D, 2D, "
                "3D or Cube";
    }

    if (info.multisampled != 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'MS' parameter to be 0";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelAvailableKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageWrite) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageWrite) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR requires "
                "NonPrivateTexelKHR is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto available_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelVisibleKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageRead) << " or Op"
             << spvOpcodeString(spv::Op::OpImageSparseRead) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR "
                "is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto visible_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::SignExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via sign extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ZeroExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via zero extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offsets)) {
    // TODO: add validation
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Nontemporal)) {
    // Checked elsewhere: SPIR-V 1.6 version or later.
  }

  return SPV_SUCCESS;
}